

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_integer_sequence.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  bool local_22;
  bool local_21;
  bool local_20;
  bool local_1f;
  bool local_1e;
  bool local_1d;
  bool local_1c;
  bool local_1b;
  bool local_1a;
  bool local_19;
  bool local_18;
  bool local_17;
  bool local_16;
  bool local_15;
  bool local_14;
  bool local_13;
  bool local_12;
  bool local_11;
  bool local_10;
  bool local_f;
  bool local_e;
  bool local_d [5];
  
  local_d[1] = false;
  local_d[2] = false;
  local_d[3] = false;
  local_d[4] = false;
  local_d[0] = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 0> , integer_sequence<int> >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x1b,"int main()",(bool *)&std::integral_constant<bool,true>::value,local_d);
  local_e = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 1> , integer_sequence<int, 0> >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x1f,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_e);
  local_f = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 2> , integer_sequence<int, 0, 1> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x23,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_f);
  local_10 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 3> , integer_sequence<int, 0, 1, 2> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x27,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_10);
  local_11 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 4> , integer_sequence<int, 0, 1, 2, 3> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x2b,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_11);
  local_12 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 5> , integer_sequence<int, 0, 1, 2, 3, 4> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x2f,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_12);
  local_13 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 6> , integer_sequence<int, 0, 1, 2, 3, 4, 5> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x33,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_13);
  local_14 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 7> , integer_sequence<int, 0, 1, 2, 3, 4, 5, 6> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x37,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_14);
  local_15 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 8> , integer_sequence<int, 0, 1, 2, 3, 4, 5, 6, 7> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x3b,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_15);
  local_16 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 9> , integer_sequence<int, 0, 1, 2, 3, 4, 5, 6, 7, 8> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x3f,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_16);
  local_17 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_integer_sequence<int, 10> , integer_sequence<int, 0, 1, 2, 3, 4, 5, 6, 7, 8, 9> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x43,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_17);
  local_18 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 0> , integer_sequence<int> >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x49,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_18);
  local_19 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 1> , integer_sequence<int, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x4d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_19);
  local_1a = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 2> , integer_sequence<int, 1, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x51,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1a);
  local_1b = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 3> , integer_sequence<int, 2, 1, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x55,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1b);
  local_1c = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 4> , integer_sequence<int, 3, 2, 1, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x59,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1c);
  local_1d = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 5> , integer_sequence<int, 4, 3, 2, 1, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x5d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1d);
  local_1e = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 6> , integer_sequence<int, 5, 4, 3, 2, 1, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x61,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1e);
  local_1f = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 7> , integer_sequence<int, 6, 5, 4, 3, 2, 1, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x65,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1f);
  local_20 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 8> , integer_sequence<int, 7, 6, 5, 4, 3, 2, 1, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x69,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_20);
  local_21 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 9> , integer_sequence<int, 8, 7, 6, 5, 4, 3, 2, 1, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x6d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_21);
  local_22 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same< make_reversed_integer_sequence<int, 10> , integer_sequence<int, 9, 8, 7, 6, 5, 4, 3, 2, 1, 0> >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_integer_sequence.cpp"
             ,0x71,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_22);
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    ///////////////////////////////////////////////////////////////////////////
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 0>
      , integer_sequence<int>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 1>
      , integer_sequence<int, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 2>
      , integer_sequence<int, 0, 1>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 3>
      , integer_sequence<int, 0, 1, 2>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 4>
      , integer_sequence<int, 0, 1, 2, 3>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 5>
      , integer_sequence<int, 0, 1, 2, 3, 4>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 6>
      , integer_sequence<int, 0, 1, 2, 3, 4, 5>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 7>
      , integer_sequence<int, 0, 1, 2, 3, 4, 5, 6>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 8>
      , integer_sequence<int, 0, 1, 2, 3, 4, 5, 6, 7>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 9>
      , integer_sequence<int, 0, 1, 2, 3, 4, 5, 6, 7, 8>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_integer_sequence<int, 10>
      , integer_sequence<int, 0, 1, 2, 3, 4, 5, 6, 7, 8, 9>
    >::value), true);

    ///////////////////////////////////////////////////////////////////////////
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 0>
      , integer_sequence<int>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 1>
      , integer_sequence<int, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 2>
      , integer_sequence<int, 1, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 3>
      , integer_sequence<int, 2, 1, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 4>
      , integer_sequence<int, 3, 2, 1, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 5>
      , integer_sequence<int, 4, 3, 2, 1, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 6>
      , integer_sequence<int, 5, 4, 3, 2, 1, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 7>
      , integer_sequence<int, 6, 5, 4, 3, 2, 1, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 8>
      , integer_sequence<int, 7, 6, 5, 4, 3, 2, 1, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 9>
      , integer_sequence<int, 8, 7, 6, 5, 4, 3, 2, 1, 0>
    >::value), true);
    BOOST_TEST_EQ((is_same<
        make_reversed_integer_sequence<int, 10>
      , integer_sequence<int, 9, 8, 7, 6, 5, 4, 3, 2, 1, 0>
    >::value), true);

    return boost::report_errors();
}